

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O0

void Sim_SymmsStructComputeOne(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,int *pMap)

{
  Vec_Ptr_t *vNodes_00;
  Vec_Ptr_t *vNodesPis0;
  Vec_Ptr_t *vNodesPis1;
  Vec_Ptr_t *vNodesOther_00;
  Abc_Obj_t *vSymms_00;
  Abc_Obj_t *pAVar1;
  int local_54;
  int i;
  Abc_Obj_t *pTemp;
  Vec_Int_t *vSymms;
  Vec_Ptr_t *vNodesOther;
  Vec_Ptr_t *vNodesPi1;
  Vec_Ptr_t *vNodesPi0;
  Vec_Ptr_t *vNodes;
  int *pMap_local;
  Abc_Obj_t *pNode_local;
  Abc_Ntk_t *pNtk_local;
  
  vNodes_00 = Vec_PtrAlloc(10);
  vNodesPis0 = Vec_PtrAlloc(10);
  vNodesPis1 = Vec_PtrAlloc(10);
  vNodesOther_00 = Vec_PtrAlloc(10);
  Sim_SymmsBalanceCollect_rec(pNode,vNodes_00);
  Sim_SymmsPartitionNodes(vNodes_00,vNodesPis0,vNodesPis1,vNodesOther_00);
  vSymms_00 = (Abc_Obj_t *)Vec_IntAlloc(10);
  Sim_SymmsAppendFromGroup(pNtk,vNodesPis0,vNodesOther_00,(Vec_Int_t *)vSymms_00,pMap);
  Sim_SymmsAppendFromGroup(pNtk,vNodesPis1,vNodesOther_00,(Vec_Int_t *)vSymms_00,pMap);
  for (local_54 = 0; local_54 < vNodesOther_00->nSize; local_54 = local_54 + 1) {
    pAVar1 = Abc_ObjRegular((Abc_Obj_t *)vNodesOther_00->pArray[local_54]);
    Sim_SymmsAppendFromNode
              (pNtk,(Vec_Int_t *)(pAVar1->field_6).pCopy,vNodesOther_00,vNodesPis0,vNodesPis1,
               (Vec_Int_t *)vSymms_00,pMap);
  }
  Vec_PtrFree(vNodes_00);
  Vec_PtrFree(vNodesPis0);
  Vec_PtrFree(vNodesPis1);
  Vec_PtrFree(vNodesOther_00);
  (pNode->field_6).pCopy = vSymms_00;
  return;
}

Assistant:

void Sim_SymmsStructComputeOne( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, int * pMap )
{
    Vec_Ptr_t * vNodes, * vNodesPi0, * vNodesPi1, * vNodesOther;
    Vec_Int_t * vSymms;
    Abc_Obj_t * pTemp;
    int i;

    // allocate the temporary arrays
    vNodes      = Vec_PtrAlloc( 10 );
    vNodesPi0   = Vec_PtrAlloc( 10 );
    vNodesPi1   = Vec_PtrAlloc( 10 );
    vNodesOther = Vec_PtrAlloc( 10 );  

    // collect the fanins of the implication supergate
    Sim_SymmsBalanceCollect_rec( pNode, vNodes );

    // sort the nodes in the implication supergate
    Sim_SymmsPartitionNodes( vNodes, vNodesPi0, vNodesPi1, vNodesOther );

    // start the resulting set
    vSymms = Vec_IntAlloc( 10 );
    // generate symmetries from the groups
    Sim_SymmsAppendFromGroup( pNtk, vNodesPi0, vNodesOther, vSymms, pMap );
    Sim_SymmsAppendFromGroup( pNtk, vNodesPi1, vNodesOther, vSymms, pMap );
    // add symmetries from other inputs
    for ( i = 0; i < vNodesOther->nSize; i++ )
    {
        pTemp = Abc_ObjRegular((Abc_Obj_t *)vNodesOther->pArray[i]);
        Sim_SymmsAppendFromNode( pNtk, SIM_READ_SYMMS(pTemp), vNodesOther, vNodesPi0, vNodesPi1, vSymms, pMap );
    }
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vNodesPi0 );
    Vec_PtrFree( vNodesPi1 );
    Vec_PtrFree( vNodesOther );

    // set the symmetry at the node
    SIM_SET_SYMMS( pNode, vSymms );
}